

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void getSubVectors(HighsIndexCollection *index_collection,HighsInt data_dim,double *data0,
                  double *data1,double *data2,HighsSparseMatrix *matrix,HighsInt *num_sub_vector,
                  double *sub_vector_data0,double *sub_vector_data1,double *sub_vector_data2,
                  HighsInt *sub_matrix_num_nz,HighsInt *sub_matrix_start,HighsInt *sub_matrix_index,
                  double *sub_matrix_value)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  HighsInt in_from_vector;
  HighsInt local_7c;
  int local_78;
  HighsInt local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  HighsSparseMatrix *local_60;
  HighsIndexCollection *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  HighsInt local_34;
  
  local_60 = matrix;
  local_58 = index_collection;
  local_50 = data0;
  local_48 = data1;
  local_40 = data2;
  limits(index_collection,&local_64,&local_68);
  local_7c = -1;
  local_74 = 0;
  *num_sub_vector = 0;
  *sub_matrix_num_nz = 0;
  while( true ) {
    if (local_68 < local_64) {
      return;
    }
    local_78 = local_64;
    updateOutInIndex(local_58,&local_6c,&local_70,&local_34,&local_7c,&local_74);
    piVar1 = (local_60->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)local_6c;
    for (lVar5 = lVar4; lVar5 <= local_70; lVar5 = lVar5 + 1) {
      iVar6 = *num_sub_vector;
      if (sub_vector_data0 != (double *)0x0) {
        sub_vector_data0[iVar6] = local_50[lVar5];
      }
      if (sub_vector_data1 != (double *)0x0) {
        sub_vector_data1[iVar6] = local_48[lVar5];
      }
      if (sub_vector_data2 != (double *)0x0) {
        sub_vector_data2[iVar6] = local_40[lVar5];
      }
      if (sub_matrix_start != (HighsInt *)0x0) {
        sub_matrix_start[iVar6] = (piVar1[lVar5] + *sub_matrix_num_nz) - piVar1[lVar4];
        iVar6 = *num_sub_vector;
      }
      *num_sub_vector = iVar6 + 1;
    }
    piVar2 = (local_60->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (local_60->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = (long)piVar1[lVar4]; lVar5 < piVar1[(long)local_70 + 1]; lVar5 = lVar5 + 1) {
      iVar6 = *sub_matrix_num_nz;
      if (sub_matrix_index != (HighsInt *)0x0) {
        sub_matrix_index[iVar6] = piVar2[lVar5];
        iVar6 = *sub_matrix_num_nz;
      }
      if (sub_matrix_value != (double *)0x0) {
        sub_matrix_value[iVar6] = pdVar3[lVar5];
      }
      *sub_matrix_num_nz = iVar6 + 1;
    }
    if (local_70 == data_dim + -1) break;
    local_64 = local_78 + 1;
    if (local_7c == data_dim + -1) {
      return;
    }
  }
  return;
}

Assistant:

void getSubVectors(const HighsIndexCollection& index_collection,
                   const HighsInt data_dim, const double* data0,
                   const double* data1, const double* data2,
                   const HighsSparseMatrix& matrix, HighsInt& num_sub_vector,
                   double* sub_vector_data0, double* sub_vector_data1,
                   double* sub_vector_data2, HighsInt& sub_matrix_num_nz,
                   HighsInt* sub_matrix_start, HighsInt* sub_matrix_index,
                   double* sub_matrix_value) {
  // Ensure that if there's no data0 then it's not required in the
  // sub-vector
  if (data0 == nullptr) assert(sub_vector_data0 == nullptr);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < data_dim);
  assert(from_k <= to_k);
  HighsInt out_from_vector;
  HighsInt out_to_vector;
  HighsInt in_from_vector;
  HighsInt in_to_vector = -1;
  HighsInt current_set_entry = 0;
  num_sub_vector = 0;
  sub_matrix_num_nz = 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, out_from_vector, out_to_vector,
                     in_from_vector, in_to_vector, current_set_entry);
    assert(out_to_vector < data_dim);
    assert(in_to_vector < data_dim);
    for (HighsInt iVector = out_from_vector; iVector <= out_to_vector;
         iVector++) {
      if (sub_vector_data0 != nullptr)
        sub_vector_data0[num_sub_vector] = data0[iVector];
      if (sub_vector_data1 != nullptr)
        sub_vector_data1[num_sub_vector] = data1[iVector];
      if (sub_vector_data2 != nullptr)
        sub_vector_data2[num_sub_vector] = data2[iVector];
      if (sub_matrix_start != nullptr)
        sub_matrix_start[num_sub_vector] = sub_matrix_num_nz +
                                           matrix.start_[iVector] -
                                           matrix.start_[out_from_vector];
      num_sub_vector++;
    }
    for (HighsInt iEl = matrix.start_[out_from_vector];
         iEl < matrix.start_[out_to_vector + 1]; iEl++) {
      if (sub_matrix_index != nullptr)
        sub_matrix_index[sub_matrix_num_nz] = matrix.index_[iEl];
      if (sub_matrix_value != nullptr)
        sub_matrix_value[sub_matrix_num_nz] = matrix.value_[iEl];
      sub_matrix_num_nz++;
    }
    if (out_to_vector == data_dim - 1 || in_to_vector == data_dim - 1) break;
  }
}